

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_map.h
# Opt level: O1

bool __thiscall CDoodadsMapper::CRule::operator<(CRule *this,CRule *Other)

{
  int iVar1;
  int iVar2;
  
  iVar1 = this->m_Location;
  iVar2 = Other->m_Location;
  if ((iVar1 == 0 && iVar2 == 0) || (iVar2 == 1 && iVar1 == 1)) {
    if ((Other->m_Size).field_0.x <= (this->m_Size).field_0.x) {
      return false;
    }
  }
  else {
    if (iVar2 != 2 || iVar1 != 2) {
      return false;
    }
    if ((Other->m_Size).field_1.y <= (this->m_Size).field_1.y) {
      return false;
    }
  }
  return true;
}

Assistant:

bool operator<(const CRule &Other) const
		{
			if((m_Location == CDoodadsMapper::CRule::FLOOR && Other.m_Location == CDoodadsMapper::CRule::FLOOR)
				|| (m_Location == CDoodadsMapper::CRule::CEILING && Other.m_Location == CDoodadsMapper::CRule::CEILING))
			{
				if(m_Size.x < Other.m_Size.x)
					return true;
			}
			else if(m_Location == CDoodadsMapper::CRule::WALLS && Other.m_Location == CDoodadsMapper::CRule::WALLS)
			{
				if(m_Size.y < Other.m_Size.y)
					return true;
			}

			return false;
		}